

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

int __thiscall userinfo_t::TeamChanged(userinfo_t *this,int team)

{
  bool bVar1;
  FBaseCVar **ppFVar2;
  FName local_14;
  
  if (teamplay.Value) {
    bVar1 = FTeam::IsValidTeam(&TeamLibrary,team);
    if (!bVar1) {
      team = D_PickRandomTeam();
    }
  }
  ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_14);
  FIntCVar::operator=((FIntCVar *)*ppFVar2,team);
  return team;
}

Assistant:

int userinfo_t::TeamChanged(int team)
{
	if (teamplay && !TeamLibrary.IsValidTeam(team))
	{ // Force players onto teams in teamplay mode
		team = D_PickRandomTeam();
	}
	*static_cast<FIntCVar *>((*this)[NAME_Team]) = team;
	return team;
}